

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

Token * __thiscall DL::Lexer::look(Token *__return_storage_ptr__,Lexer *this)

{
  line_t lVar1;
  column_t cVar2;
  
  lVar1 = this->mLineNumber;
  cVar2 = this->mColumnNumber;
  next(__return_storage_ptr__,this);
  (this->mNextToken).Type = __return_storage_ptr__->Type;
  std::__cxx11::string::_M_assign((string *)&(this->mNextToken).Value);
  this->mNextLineNumber = this->mLineNumber;
  this->mNextColumnNumber = this->mColumnNumber;
  this->mColumnNumber = cVar2;
  this->mLineNumber = lVar1;
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::look()
{
	line_t l   = mLineNumber;
	column_t c = mColumnNumber;

	Token t = next();
	// Save for next() call
	mNextToken		  = t;
	mNextColumnNumber = mColumnNumber;
	mNextLineNumber   = mLineNumber;

	mColumnNumber = c;
	mLineNumber   = l;
	return t;
}